

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.c
# Opt level: O3

Class class_setSuperclass(Class cls,Class newSuper)

{
  Class poVar1;
  Class poVar2;
  unsigned_long uVar3;
  Class *ppoVar4;
  Class poVar5;
  Class poVar6;
  Class poVar7;
  mutex_t *lock;
  
  if (newSuper == (Class)0x0 || cls == (Class)0x0) {
    poVar7 = (Class)0x0;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)&runtime_mutex);
    poVar7 = cls->super_class;
    if (poVar7 == newSuper) {
      pthread_mutex_unlock((pthread_mutex_t *)&runtime_mutex);
      poVar7 = newSuper;
    }
    else {
      if ((cls->info & 0x200) != 0) {
        poVar1 = poVar7->subclass_list;
        if (poVar7->subclass_list == cls) {
          ppoVar4 = &poVar7->subclass_list;
        }
        else {
          do {
            poVar5 = poVar1;
            if (poVar5 == (Class)0x0) goto LAB_00114d90;
            poVar1 = poVar5->sibling_class;
          } while (poVar5->sibling_class != cls);
          ppoVar4 = &poVar5->sibling_class;
        }
        *ppoVar4 = cls->sibling_class;
      }
LAB_00114d90:
      objc_resolve_class(newSuper);
      cls->super_class = newSuper;
      cls->sibling_class = newSuper->subclass_list;
      newSuper->subclass_list = cls;
      if ((cls->info & 1) == 0) {
        poVar1 = cls->isa;
        poVar5 = newSuper->isa;
        if ((poVar1->info & 0x200) != 0) {
          poVar2 = poVar1->super_class->subclass_list;
          if (poVar2 == poVar1) {
            ppoVar4 = &poVar1->super_class->subclass_list;
          }
          else {
            do {
              poVar6 = poVar2;
              if (poVar6 == (Class)0x0) goto LAB_00114def;
              poVar2 = poVar6->sibling_class;
            } while (poVar6->sibling_class != poVar1);
            ppoVar4 = &poVar6->sibling_class;
          }
          *ppoVar4 = poVar1->sibling_class;
        }
LAB_00114def:
        objc_resolve_class(poVar5);
        poVar1->super_class = poVar5;
        poVar1->isa = poVar5->isa;
        poVar1->sibling_class = poVar5->subclass_list;
        poVar5->subclass_list = poVar1;
      }
      else {
        cls->isa = newSuper->isa;
      }
      pthread_mutex_lock((pthread_mutex_t *)&initialize_lock);
      uVar3 = cls->info;
      pthread_mutex_unlock((pthread_mutex_t *)&initialize_lock);
      pthread_mutex_unlock((pthread_mutex_t *)&runtime_mutex);
      if (((uint)uVar3 >> 8 & 1) != 0) {
        objc_send_initialize((id)newSuper);
        objc_update_dtable_for_new_superclass(cls->isa,newSuper->isa);
        objc_update_dtable_for_new_superclass(cls,newSuper);
      }
    }
  }
  return poVar7;
}

Assistant:

__attribute__((deprecated))
Class class_setSuperclass(Class cls, Class newSuper)
{
	CHECK_ARG(cls);
	CHECK_ARG(newSuper);
	Class oldSuper;
	if (Nil == cls) { return Nil; }

	{
		LOCK_RUNTIME_FOR_SCOPE();

		oldSuper = cls->super_class;

		if (oldSuper == newSuper) { return newSuper; }

		safe_remove_from_subclass_list(cls);
		objc_resolve_class(newSuper);

		cls->super_class = newSuper;

		// The super class's subclass list is used in certain method resolution scenarios.
		cls->sibling_class = cls->super_class->subclass_list;
		cls->super_class->subclass_list = cls;

		if (UNLIKELY(class_isMetaClass(cls)))
		{
			// newSuper is presumably a metaclass. Its isa will therefore be the appropriate root metaclass.
			cls->isa = newSuper->isa;
		}
		else
		{
			Class meta = cls->isa, newSuperMeta = newSuper->isa;
			// Update the metaclass's superclass.
			safe_remove_from_subclass_list(meta);
			objc_resolve_class(newSuperMeta);

			meta->super_class = newSuperMeta;
			meta->isa = newSuperMeta->isa;

			// The super class's subclass list is used in certain method resolution scenarios.
			meta->sibling_class = newSuperMeta->subclass_list;
			newSuperMeta->subclass_list = meta;
		}

		LOCK_FOR_SCOPE(&initialize_lock);
		if (!objc_test_class_flag(cls, objc_class_flag_initialized))
		{
			// Uninitialized classes don't have dtables to update
			// and don't need their superclasses initialized.
			return oldSuper;
		}
	}

	objc_send_initialize((id)newSuper); // also initializes the metaclass
	objc_update_dtable_for_new_superclass(cls->isa, newSuper->isa);
	objc_update_dtable_for_new_superclass(cls, newSuper);

	return oldSuper;
}